

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,uint *_value)

{
  long *plVar1;
  uint local_20;
  ushort local_1c;
  byte local_19;
  uint32_t tmp_uint32_t;
  uint16_t tmp_uint16_t;
  uint8_t tmp_uchar;
  
  if (_type < ValueTypeFLOAT32) {
    if ((0x18U >> (_type & (ValueTypeDOUBLE|ValueTypeFLOAT64)) & 1) == 0) {
      if ((0x180U >> (_type & (ValueTypeDOUBLE|ValueTypeFLOAT64)) & 1) == 0) {
        if ((0x1800U >> (_type & (ValueTypeDOUBLE|ValueTypeFLOAT64)) & 1) == 0) goto LAB_0017c46c;
        binary<unsigned_int>::restore(_in,&local_20,SUB41(((this->options_).flags_ & 2U) >> 1,0));
      }
      else {
        binary<unsigned_short>::restore(_in,&local_1c,SUB41(((this->options_).flags_ & 2U) >> 1,0));
        local_20 = (uint)local_1c;
      }
    }
    else {
      std::istream::read((char *)_in,(long)&local_19);
      local_20 = (uint)local_19;
    }
    *_value = local_20;
    return;
  }
LAB_0017c46c:
  *_value = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"unsupported conversion type to unsigned int: ",0x2d);
  plVar1 = (long *)std::ostream::operator<<(&std::cerr,_type);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, unsigned int& _value) const {

    uint32_t tmp_uint32_t;
    uint16_t tmp_uint16_t;
    uint8_t tmp_uchar;

    switch (_type) {

        case ValueTypeUINT:

        case ValueTypeUINT32:

            restore(_in, tmp_uint32_t, options_.check(Options::MSB));
            _value = tmp_uint32_t;

        break;

        case ValueTypeUSHORT:

        case ValueTypeUINT16:

            restore(_in, tmp_uint16_t, options_.check(Options::MSB));
            _value = tmp_uint16_t;

            break;

        case ValueTypeUCHAR:

        case ValueTypeUINT8:

            restore(_in, tmp_uchar, options_.check(Options::MSB));
            _value = tmp_uchar;

            break;

        default:

            _value = 0;
            std::cerr << "unsupported conversion type to unsigned int: " << _type << std::endl;

            break;
    }
}